

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_not_equals_different_Test::TestBody
          (ByteBufferTest_test_not_equals_different_Test *this)

{
  char *message;
  AssertHelper AStack_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertionResult gtest_ar;
  ByteBuffer b;
  ByteBuffer a;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&a,2);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&a);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&a);
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&b,2);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&b);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&b);
  testing::internal::
  CmpHelperNE<bidfx_public_api::tools::ByteBuffer,bidfx_public_api::tools::ByteBuffer>
            ((internal *)&gtest_ar,"a","b",&a,&b);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xfa,message);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&b);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&a);
  return;
}

Assistant:

TEST(ByteBufferTest, test_not_equals_different)
{
    ByteBuffer a(2);
    a.WriteByte(2);
    a.WriteByte(3);
    ByteBuffer b(2);
    b.WriteByte(2);
    b.WriteByte(6);
    EXPECT_NE(a, b);
}